

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

int mbedtls_base64_encode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar *puVar4;
  uchar uVar5;
  ulong uVar6;
  uint uVar7;
  
  if (slen == 0) {
    *olen = 0;
    return 0;
  }
  uVar6 = (slen / 3 + 1) - (ulong)(slen % 3 == 0);
  if (uVar6 >> 0x3e == 0) {
    uVar6 = uVar6 * 4;
    if (uVar6 < dlen) {
      puVar4 = dst;
      for (uVar6 = 1; uVar6 - 1 < (slen / 3) * 3; uVar6 = uVar6 + 3) {
        bVar1 = src[uVar6 - 1];
        bVar2 = src[uVar6];
        bVar3 = src[uVar6 + 1];
        *puVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
        puVar4[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(bVar1 & 3) << 4 | (uint)(bVar2 >> 4)];
        puVar4[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(uint)(bVar3 >> 6) + (bVar2 & 0xf) * 4];
        puVar4[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f]
        ;
        puVar4 = puVar4 + 4;
      }
      if (uVar6 - 1 < slen) {
        bVar1 = src[uVar6 - 1];
        uVar7 = 0;
        if (uVar6 < slen) {
          uVar7 = (uint)src[uVar6];
        }
        *puVar4 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2];
        puVar4[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(bVar1 & 3) << 4 | uVar7 >> 4];
        uVar5 = '=';
        if (uVar6 < slen) {
          uVar5 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(ulong)(uVar7 & 0xf) * 4];
        }
        puVar4[2] = uVar5;
        puVar4[3] = '=';
        puVar4 = puVar4 + 4;
      }
      *olen = (long)puVar4 - (long)dst;
      *puVar4 = '\0';
      return 0;
    }
    *olen = uVar6 | 1;
  }
  else {
    *olen = 0xffffffffffffffff;
  }
  return -0x2a;
}

Assistant:

int mbedtls_base64_encode( unsigned char *dst, size_t dlen, size_t *olen,
                   const unsigned char *src, size_t slen )
{
    size_t i, n;
    int C1, C2, C3;
    unsigned char *p;

    if( slen == 0 )
    {
        *olen = 0;
        return( 0 );
    }

    n = slen / 3 + ( slen % 3 != 0 );

    if( n > ( BASE64_SIZE_T_MAX - 1 ) / 4 )
    {
        *olen = BASE64_SIZE_T_MAX;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    n *= 4;

    if( dlen < n + 1 )
    {
        *olen = n + 1;
        return( MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL );
    }

    n = ( slen / 3 ) * 3;

    for( i = 0, p = dst; i < n; i += 3 )
    {
        C1 = *src++;
        C2 = *src++;
        C3 = *src++;

        *p++ = base64_enc_map[(C1 >> 2) & 0x3F];
        *p++ = base64_enc_map[(((C1 &  3) << 4) + (C2 >> 4)) & 0x3F];
        *p++ = base64_enc_map[(((C2 & 15) << 2) + (C3 >> 6)) & 0x3F];
        *p++ = base64_enc_map[C3 & 0x3F];
    }

    if( i < slen )
    {
        C1 = *src++;
        C2 = ( ( i + 1 ) < slen ) ? *src++ : 0;

        *p++ = base64_enc_map[(C1 >> 2) & 0x3F];
        *p++ = base64_enc_map[(((C1 & 3) << 4) + (C2 >> 4)) & 0x3F];

        if( ( i + 1 ) < slen )
             *p++ = base64_enc_map[((C2 & 15) << 2) & 0x3F];
        else *p++ = '=';

        *p++ = '=';
    }

    *olen = p - dst;
    *p = 0;

    return( 0 );
}